

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

void stream_drain_callback(pa_mainloop_api *a,pa_time_event *e,timeval *tv,void *u)

{
  if (*(pa_time_event **)((long)u + 0x30) == e) {
    *(undefined4 *)((long)u + 0x58) = 2;
    (**(code **)((long)u + 0x28))(u,*(undefined8 *)((long)u + 8),2);
    (*a->time_free)(*(pa_time_event **)((long)u + 0x30));
    *(undefined8 *)((long)u + 0x30) = 0;
    (*cubeb_pa_threaded_mainloop_signal)(*(pa_threaded_mainloop **)(*u + 0x10),0);
    return;
  }
  __assert_fail("stm->drain_timer == e",
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                ,0xe8,
                "void stream_drain_callback(pa_mainloop_api *, pa_time_event *, const struct timeval *, void *)"
               );
}

Assistant:

static void
stream_drain_callback(pa_mainloop_api * a, pa_time_event * e,
                      struct timeval const * tv, void * u)
{
  (void)a;
  (void)tv;
  cubeb_stream * stm = u;
  assert(stm->drain_timer == e);
  stream_state_change_callback(stm, CUBEB_STATE_DRAINED);
  /* there's no pa_rttime_free, so use this instead. */
  a->time_free(stm->drain_timer);
  stm->drain_timer = NULL;
  WRAP(pa_threaded_mainloop_signal)(stm->context->mainloop, 0);
}